

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyContainer.hh
# Opt level: O2

BasePropHandleT<unsigned_int> __thiscall
OpenMesh::PropertyContainer::handle<unsigned_int>
          (PropertyContainer *this,uint *param_1,string *_name)

{
  pointer ppBVar1;
  pointer ppBVar2;
  BaseProperty *pBVar3;
  __type _Var4;
  long lVar5;
  long lVar6;
  int iVar7;
  
  ppBVar2 = (this->properties_).
            super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar6 = 0;
  iVar7 = 0;
  while( true ) {
    ppBVar1 = (pointer)((long)ppBVar2 + lVar6);
    if (ppBVar1 ==
        (this->properties_).
        super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      return (BaseHandle)-1;
    }
    pBVar3 = *ppBVar1;
    if ((((pBVar3 != (BaseProperty *)0x0) && (_Var4 = std::operator==(&pBVar3->name_,_name), _Var4))
        && (lVar5 = *(long *)((long)(this->properties_).
                                    super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar6), lVar5 != 0))
       && (lVar5 = __dynamic_cast(lVar5,&BaseProperty::typeinfo,&PropertyT<unsigned_int>::typeinfo,0
                                 ), lVar5 != 0)) break;
    iVar7 = iVar7 + 1;
    lVar6 = lVar6 + 8;
  }
  return (BasePropHandleT<unsigned_int>)(BaseHandle)iVar7;
}

Assistant:

BasePropHandleT<T> handle(const T&, const std::string& _name) const
  {
    Properties::const_iterator p_it = properties_.begin();
    for (int idx=0; p_it != properties_.end(); ++p_it, ++idx)
    {
      if (*p_it != NULL &&
         (*p_it)->name() == _name  //skip deleted properties
// Skip type check
#ifndef OM_FORCE_STATIC_CAST
          && dynamic_cast<PropertyT<T>*>(properties_[idx]) != NULL //check type
#endif
         )
      {
        return BasePropHandleT<T>(idx);
      }
    }
    return BasePropHandleT<T>();
  }